

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

void __thiscall
helics::InputInfo::removeSource(InputInfo *this,GlobalHandle sourceToRemove,Time minTime)

{
  pointer pGVar1;
  pointer pvVar2;
  pointer pdVar3;
  pointer pTVar4;
  size_t ii;
  ulong uVar5;
  
  (this->inputUnits)._M_string_length = 0;
  *(this->inputUnits)._M_dataplus._M_p = '\0';
  (this->inputType)._M_string_length = 0;
  *(this->inputType)._M_dataplus._M_p = '\0';
  for (uVar5 = 0;
      pGVar1 = (this->input_sources).
               super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->input_sources).
                            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pGVar1 >> 3);
      uVar5 = uVar5 + 1) {
    if ((pGVar1[uVar5].fed_id.gid == sourceToRemove.fed_id.gid.gid) &&
       (pGVar1[uVar5].handle.hid == sourceToRemove.handle.hid.hid)) {
      while( true ) {
        pvVar2 = (this->data_queues).
                 super__Vector_base<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar3 = *(pointer *)
                  ((long)&pvVar2[uVar5].
                          super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
                          ._M_impl.super__Vector_impl_data + 8);
        if ((pvVar2[uVar5].
             super__Vector_base<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>
             ._M_impl.super__Vector_impl_data._M_start == pdVar3) ||
           (pdVar3[-1].time.internalTimeCode <= minTime.internalTimeCode)) break;
        std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>::
        pop_back(pvVar2 + uVar5);
      }
      pTVar4 = (this->deactivated).
               super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (minTime.internalTimeCode < pTVar4[uVar5].internalTimeCode) {
        pTVar4[uVar5].internalTimeCode = minTime.internalTimeCode;
      }
    }
  }
  return;
}

Assistant:

void InputInfo::removeSource(GlobalHandle sourceToRemove, Time minTime)
{
    // the inputUnits and type are not determined anymore since the source list has changed
    inputUnits.clear();
    inputType.clear();
    for (size_t ii = 0; ii < input_sources.size(); ++ii) {
        if (input_sources[ii] == sourceToRemove) {
            while ((!data_queues[ii].empty()) && (data_queues[ii].back().time > minTime)) {
                data_queues[ii].pop_back();
            }
            if (minTime < deactivated[ii]) {
                deactivated[ii] = minTime;
            }
        }
        // there could be duplicate sources so we need to do the full loop
    }
}